

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor.h
# Opt level: O2

void escreverCor(ostream *out,cor corPixel,int samplesPorPixel)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = 1.0 / (double)samplesPorPixel;
  dVar2 = corPixel.e[0] * dVar5;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = corPixel.e[1] * dVar5;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar5 = dVar5 * corPixel.e[2];
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar4 = 0.999;
  if (dVar2 <= 0.999) {
    dVar4 = dVar2;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)out,(int)(double)(~-(ulong)(dVar2 < 0.0) & (ulong)(dVar4 * 256.0)))
  ;
  poVar1 = std::operator<<(poVar1,' ');
  dVar2 = 0.999;
  if (dVar3 <= 0.999) {
    dVar2 = dVar3;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,
                      (int)(double)(~-(ulong)(dVar3 < 0.0) & (ulong)(dVar2 * 256.0)));
  poVar1 = std::operator<<(poVar1,' ');
  dVar2 = 0.999;
  if (dVar5 <= 0.999) {
    dVar2 = dVar5;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,
                      (int)(double)(~-(ulong)(dVar5 < 0.0) & (ulong)(dVar2 * 256.0)));
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void escreverCor(std::ostream &out, cor corPixel, const int samplesPorPixel) {
    const double escala = 1.0 / samplesPorPixel;

    // Pegar a cor de cada pixel, dividindo pela escala
    // Realizar correção de gamma para gamma 2
    const double r = sqrt(corPixel.x() * escala);
    const double g = sqrt(corPixel.y() * escala);
    const double b = sqrt(corPixel.z() * escala);

    // Escrever as cores mapeadas entre 0 <= cor < 1
    out << static_cast<int>(256 * clamp(r, 0.0, 0.999)) << ' '
        << static_cast<int>(256 * clamp(g, 0.0, 0.999)) << ' '
        << static_cast<int>(256 * clamp(b, 0.0, 0.999)) << '\n';
}